

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O1

void lua_pushlstring(lua_State *L,char *str,size_t len)

{
  TValue *pTVar1;
  ulong uVar2;
  GCstr *pGVar3;
  
  uVar2 = (ulong)(L->glref).ptr32;
  if (*(uint *)(uVar2 + 0x24) <= *(uint *)(uVar2 + 0x20)) {
    lj_gc_step(L);
  }
  pGVar3 = lj_str_new(L,str,len);
  pTVar1 = L->top;
  (pTVar1->u32).lo = (uint32_t)pGVar3;
  (pTVar1->field_2).it = 0xfffffffb;
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  if (pTVar1 + 1 < (TValue *)(ulong)(L->maxstack).ptr32) {
    return;
  }
  lj_state_growstack(L,1);
  return;
}

Assistant:

LUA_API void lua_pushlstring(lua_State *L, const char *str, size_t len)
{
  GCstr *s;
  lj_gc_check(L);
  s = lj_str_new(L, str, len);
  setstrV(L, L->top, s);
  incr_top(L);
}